

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall VW::ptr_queue<example>::ptr_queue(ptr_queue<example> *this,size_t max_size)

{
  queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  std::queue<example*,std::deque<example*,std::allocator<example*>>>::
  queue<std::deque<example*,std::allocator<example*>>,void>(in_RSI);
  std::mutex::mutex((mutex *)0x1858a5);
  *(undefined1 *)(in_RDI + 0x10) = 0;
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x11));
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x17));
  return;
}

Assistant:

ptr_queue(size_t max_size)
      : max_size(max_size)
    {}